

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_pool_test.cc
# Opt level: O1

void __thiscall ccel_handler_pool_test::test_method(ccel_handler_pool_test *this)

{
  test_handler_class *a;
  handler_pool<test_handler_class> pool1;
  entry_value_collector local_271;
  test_handler_class *local_270;
  undefined **local_268;
  element_type *local_260;
  shared_count sStack_258;
  char *local_250;
  begin local_248;
  lazy_ostream local_230;
  assertion_result *local_220;
  begin *local_218;
  const_string local_210;
  const_string local_200;
  handler_pool<test_handler_class> local_1f0;
  
  ccel::handler_pool<test_handler_class>::handler_pool(&local_1f0,0,0);
  local_230._vptr_lazy_ostream = (_func_int **)CONCAT44(local_230._vptr_lazy_ostream._4_4_,1);
  local_270 = ccel::handler_pool<test_handler_class>::construct<int>(&local_1f0,(int *)&local_230);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1d1880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ac62e);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  local_268 = (undefined **)CONCAT71(local_268._1_7_,local_270 != (test_handler_class *)0x0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x11;
  local_260 = (element_type *)0x0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_220 = (assertion_result *)boost::unit_test::lazy_ostream::instance();
  local_218 = &local_248;
  local_248.m_file_name.m_begin = "a != nullptr";
  local_248.m_file_name.m_end = "";
  local_230.m_empty = false;
  local_230._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ce410;
  local_200.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  local_200.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_268,&local_230,&local_200,0x11,CHECK,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&sStack_258);
  local_248.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  local_248.m_file_name.m_end = "";
  local_248.m_line_num = 0x12;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_248);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_271.m_last = true;
  sStack_258.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::instance();
  local_260 = (element_type *)((ulong)local_260 & 0xffffffffffffff00);
  local_268 = &PTR__lazy_ostream_001ce450;
  local_250 = "Address of a:";
  local_230.m_empty = false;
  local_230._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ce490;
  local_218 = (begin *)&local_270;
  local_220 = (assertion_result *)&local_268;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector(&local_271);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1d1880,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ac62e);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x13;
  local_268 = (undefined **)CONCAT71(local_268._1_7_,local_270->_value == 1);
  local_260 = (element_type *)0x0;
  sStack_258.pi_ = (sp_counted_base *)0x0;
  local_220 = (assertion_result *)boost::unit_test::lazy_ostream::instance();
  local_248.m_file_name.m_begin = "a->get_value() == 1";
  local_248.m_file_name.m_end = "";
  local_230.m_empty = false;
  local_230._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001ce410;
  local_210.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/unit_test/handler_pool_test.cc"
  ;
  local_210.m_end = "";
  local_218 = &local_248;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_268,&local_230,&local_210,0x13,REQUIRE,CHECK_PRED,0);
  boost::detail::shared_count::~shared_count(&sStack_258);
  ccel::handler_pool<test_handler_class>::~handler_pool(&local_1f0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( ccel_handler_pool_test)
{
  ccel::handler_pool<test_handler_class> pool1;
  auto a=pool1.construct(1);
  BOOST_CHECK(a != nullptr);
  BOOST_TEST_MESSAGE("Address of a:"<<a);
  BOOST_REQUIRE(a->get_value() == 1);
}